

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  bool bVar1;
  size_type sVar2;
  ColourImpl *pCVar3;
  ColourGuard *rhs;
  pointer _string;
  reference pvVar4;
  ostream *poVar5;
  lineOfChars local_81;
  ColourGuard local_80;
  lineOfChars local_69;
  undefined1 auStack_68 [8];
  SourceLineInfo lineInfo;
  iterator itEnd;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  local_48;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  it;
  ColourGuard local_30;
  undefined1 local_20 [8];
  ColourGuard guard;
  ConsoleReporter *this_local;
  
  guard._8_8_ = this;
  bVar1 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::empty
                    (&(this->super_StreamingReporterBase).m_sectionStack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_sectionStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                  ,0x2259,"void Catch::ConsoleReporter::printTestCaseAndSectionHeader()");
  }
  printOpenHeader(this,&((this->super_StreamingReporterBase).currentTestCaseInfo)->name);
  sVar2 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                    (&(this->super_StreamingReporterBase).m_sectionStack);
  if (1 < sVar2) {
    pCVar3 = Detail::unique_ptr<Catch::ColourImpl>::operator->
                       (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
    ColourImpl::guardColour((ColourImpl *)&local_30,(Code)pCVar3);
    rhs = ColourImpl::ColourGuard::engage
                    (&local_30,(this->super_StreamingReporterBase).super_ReporterBase.m_stream);
    ColourImpl::ColourGuard::ColourGuard((ColourGuard *)local_20,rhs);
    ColourImpl::ColourGuard::~ColourGuard(&local_30);
    itEnd = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::begin
                      (&(this->super_StreamingReporterBase).m_sectionStack);
    local_48 = __gnu_cxx::
               __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
               ::operator+(&itEnd,1);
    lineInfo.line =
         (size_t)std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::end
                           (&(this->super_StreamingReporterBase).m_sectionStack);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&local_48,
                         (__normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                          *)&lineInfo.line);
      if (!bVar1) break;
      _string = __gnu_cxx::
                __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                ::operator->(&local_48);
      printHeaderString(this,&_string->name,2);
      __gnu_cxx::
      __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
      ::operator++(&local_48);
    }
    ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)local_20);
  }
  pvVar4 = std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::back
                     (&(this->super_StreamingReporterBase).m_sectionStack);
  auStack_68 = (undefined1  [8])(pvVar4->lineInfo).file;
  lineInfo.file = (char *)(pvVar4->lineInfo).line;
  poVar5 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  lineOfChars::lineOfChars(&local_69,'-');
  poVar5 = Catch::operator<<(poVar5,local_69);
  poVar5 = std::operator<<(poVar5,'\n');
  pCVar3 = Detail::unique_ptr<Catch::ColourImpl>::operator->
                     (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
  ColourImpl::guardColour((ColourImpl *)&local_80,(Code)pCVar3);
  poVar5 = Catch::operator<<(poVar5,&local_80);
  poVar5 = Catch::operator<<(poVar5,(SourceLineInfo *)auStack_68);
  poVar5 = std::operator<<(poVar5,'\n');
  lineOfChars::lineOfChars(&local_81,'.');
  poVar5 = Catch::operator<<(poVar5,local_81);
  poVar5 = std::operator<<(poVar5,"\n\n");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  ColourImpl::ColourGuard::~ColourGuard(&local_80);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        auto guard = m_colour->guardColour( Colour::Headers ).engage( m_stream );

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;


    m_stream << lineOfChars( '-' ) << '\n'
             << m_colour->guardColour( Colour::FileName ) << lineInfo << '\n'
             << lineOfChars( '.' ) << "\n\n"
             << std::flush;
}